

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O0

Vector3d * opengv::generateRandomTranslation(double maximumParallax)

{
  int iVar1;
  Scalar *pSVar2;
  Vector3d *in_RDI;
  Vector3d translation;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_ffffffffffffff90;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this;
  StorageBaseType *in_stack_ffffffffffffffd0;
  double *in_stack_ffffffffffffffd8;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x128dce6);
  iVar1 = rand();
  other = (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)(((double)iVar1 / 2147483647.0 - 0.5) * 2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff90,(Index)other);
  *pSVar2 = (Scalar)other;
  iVar1 = rand();
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
         (((double)iVar1 / 2147483647.0 - 0.5) * 2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)other);
  *pSVar2 = (Scalar)this;
  iVar1 = rand();
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)other);
  *pSVar2 = ((double)iVar1 / 2147483647.0 - 0.5) * 2.0;
  Eigen::operator*(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,other);
  return in_RDI;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomTranslation( double maximumParallax )
{
  Eigen::Vector3d translation;
  translation[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  translation[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  translation[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  return maximumParallax * translation;
}